

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall reduceDB_tch::operator()(reduceDB_tch *this,CRef x,CRef y)

{
  uint uVar1;
  Clause *pCVar2;
  uint32_t *puVar3;
  ClauseAllocator *in_RDI;
  Ref in_stack_ffffffffffffffdc;
  
  pCVar2 = Minisat::ClauseAllocator::operator[](in_RDI,in_stack_ffffffffffffffdc);
  puVar3 = Minisat::Clause::touched(pCVar2);
  uVar1 = *puVar3;
  pCVar2 = Minisat::ClauseAllocator::operator[](in_RDI,in_stack_ffffffffffffffdc);
  puVar3 = Minisat::Clause::touched(pCVar2);
  return uVar1 < *puVar3;
}

Assistant:

bool operator()(CRef x, CRef y) const { return ca[x].touched() < ca[y].touched(); }